

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktUniformBlockTests.cpp
# Opt level: O0

void __thiscall
vkt::ubo::anon_unknown_0::BlockSingleNestedStructCase::BlockSingleNestedStructCase
          (BlockSingleNestedStructCase *this,TestContext *testCtx,string *name,string *description,
          deUint32 layoutFlags,BufferMode bufferMode,int numInstances,MatrixLoadFlags matrixLoadFlag
          )

{
  StructType *pSVar1;
  UniformBlock *pUVar2;
  allocator<char> local_449;
  string local_448;
  VarType local_428;
  allocator<char> local_409;
  string local_408;
  Uniform local_3e8;
  VarType local_3a8;
  allocator<char> local_389;
  string local_388;
  Uniform local_368;
  VarType local_328;
  allocator<char> local_309;
  string local_308;
  Uniform local_2e8;
  VarType local_2a8;
  allocator<char> local_289;
  string local_288;
  Uniform local_268;
  allocator<char> local_221;
  string local_220;
  UniformBlock *local_200;
  UniformBlock *block;
  allocator<char> local_1d9;
  string local_1d8;
  VarType local_1b8;
  allocator<char> local_199;
  string local_198;
  allocator<char> local_171;
  string local_170;
  StructType *local_150;
  StructType *typeT;
  allocator<char> local_129;
  string local_128;
  VarType local_108;
  VarType local_f0;
  allocator<char> local_d1;
  string local_d0;
  VarType local_b0;
  allocator<char> local_91;
  string local_90;
  allocator<char> local_59;
  string local_58;
  StructType *local_38;
  StructType *typeS;
  BufferMode bufferMode_local;
  deUint32 layoutFlags_local;
  string *description_local;
  string *name_local;
  TestContext *testCtx_local;
  BlockSingleNestedStructCase *this_local;
  
  typeS._0_4_ = bufferMode;
  typeS._4_4_ = layoutFlags;
  _bufferMode_local = description;
  description_local = name;
  name_local = (string *)testCtx;
  testCtx_local = (TestContext *)this;
  UniformBlockCase::UniformBlockCase
            (&this->super_UniformBlockCase,testCtx,name,description,bufferMode,matrixLoadFlag,false)
  ;
  (this->super_UniformBlockCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__BlockSingleNestedStructCase_016680c0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"S",&local_59);
  pSVar1 = ShaderInterface::allocStruct(&(this->super_UniformBlockCase).m_interface,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  local_38 = pSVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"a",&local_91);
  VarType::VarType(&local_b0,TYPE_INT_VEC3,4);
  StructType::addMember(pSVar1,&local_90,&local_b0,0);
  VarType::~VarType(&local_b0);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  pSVar1 = local_38;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"b",&local_d1);
  VarType::VarType(&local_108,TYPE_FLOAT_MAT3,2);
  VarType::VarType(&local_f0,&local_108,4);
  StructType::addMember(pSVar1,&local_d0,&local_f0,0);
  VarType::~VarType(&local_f0);
  VarType::~VarType(&local_108);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator(&local_d1);
  pSVar1 = local_38;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,"c",&local_129);
  VarType::VarType((VarType *)&typeT,TYPE_FLOAT_VEC4,4);
  StructType::addMember(pSVar1,&local_128,(VarType *)&typeT,0x1800);
  VarType::~VarType((VarType *)&typeT);
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator(&local_129);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_170,"T",&local_171);
  pSVar1 = ShaderInterface::allocStruct(&(this->super_UniformBlockCase).m_interface,&local_170);
  std::__cxx11::string::~string((string *)&local_170);
  std::allocator<char>::~allocator(&local_171);
  local_150 = pSVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_198,"a",&local_199);
  VarType::VarType(&local_1b8,TYPE_FLOAT_MAT3,2);
  StructType::addMember(pSVar1,&local_198,&local_1b8,0);
  VarType::~VarType(&local_1b8);
  std::__cxx11::string::~string((string *)&local_198);
  std::allocator<char>::~allocator(&local_199);
  pSVar1 = local_150;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,"b",&local_1d9);
  VarType::VarType((VarType *)&block,local_38,0);
  StructType::addMember(pSVar1,&local_1d8,(VarType *)&block,0);
  VarType::~VarType((VarType *)&block);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::allocator<char>::~allocator(&local_1d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_220,"Block",&local_221);
  pUVar2 = ShaderInterface::allocBlock(&(this->super_UniformBlockCase).m_interface,&local_220);
  std::__cxx11::string::~string((string *)&local_220);
  std::allocator<char>::~allocator(&local_221);
  local_200 = pUVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_288,"s",&local_289);
  VarType::VarType(&local_2a8,local_38,0);
  Uniform::Uniform(&local_268,&local_288,&local_2a8,0);
  UniformBlock::addUniform(pUVar2,&local_268);
  Uniform::~Uniform(&local_268);
  VarType::~VarType(&local_2a8);
  std::__cxx11::string::~string((string *)&local_288);
  std::allocator<char>::~allocator(&local_289);
  pUVar2 = local_200;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_308,"v",&local_309);
  VarType::VarType(&local_328,TYPE_FLOAT_VEC2,1);
  Uniform::Uniform(&local_2e8,&local_308,&local_328,0x1800);
  UniformBlock::addUniform(pUVar2,&local_2e8);
  Uniform::~Uniform(&local_2e8);
  VarType::~VarType(&local_328);
  std::__cxx11::string::~string((string *)&local_308);
  std::allocator<char>::~allocator(&local_309);
  pUVar2 = local_200;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_388,"t",&local_389);
  VarType::VarType(&local_3a8,local_150,0);
  Uniform::Uniform(&local_368,&local_388,&local_3a8,0);
  UniformBlock::addUniform(pUVar2,&local_368);
  Uniform::~Uniform(&local_368);
  VarType::~VarType(&local_3a8);
  std::__cxx11::string::~string((string *)&local_388);
  std::allocator<char>::~allocator(&local_389);
  pUVar2 = local_200;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_408,"u",&local_409);
  VarType::VarType(&local_428,TYPE_UINT,4);
  Uniform::Uniform(&local_3e8,&local_408,&local_428,0);
  UniformBlock::addUniform(pUVar2,&local_3e8);
  Uniform::~Uniform(&local_3e8);
  VarType::~VarType(&local_428);
  std::__cxx11::string::~string((string *)&local_408);
  std::allocator<char>::~allocator(&local_409);
  UniformBlock::setFlags(local_200,typeS._4_4_);
  pUVar2 = local_200;
  if (0 < numInstances) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_448,"block",&local_449);
    UniformBlock::setInstanceName(pUVar2,&local_448);
    std::__cxx11::string::~string((string *)&local_448);
    std::allocator<char>::~allocator(&local_449);
    UniformBlock::setArraySize(local_200,numInstances);
  }
  (*(this->super_UniformBlockCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[2])()
  ;
  return;
}

Assistant:

BlockSingleNestedStructCase (tcu::TestContext& testCtx, const std::string& name, const std::string& description, deUint32 layoutFlags, BufferMode bufferMode, int numInstances, MatrixLoadFlags matrixLoadFlag)
		: UniformBlockCase	(testCtx, name, description, bufferMode, matrixLoadFlag)
	{
		StructType& typeS = m_interface.allocStruct("S");
		typeS.addMember("a", VarType(glu::TYPE_INT_VEC3, PRECISION_HIGH));
		typeS.addMember("b", VarType(VarType(glu::TYPE_FLOAT_MAT3, PRECISION_MEDIUM), 4));
		typeS.addMember("c", VarType(glu::TYPE_FLOAT_VEC4, PRECISION_HIGH), UNUSED_BOTH);

		StructType& typeT = m_interface.allocStruct("T");
		typeT.addMember("a", VarType(glu::TYPE_FLOAT_MAT3, PRECISION_MEDIUM));
		typeT.addMember("b", VarType(&typeS));

		UniformBlock& block = m_interface.allocBlock("Block");
		block.addUniform(Uniform("s", VarType(&typeS), 0));
		block.addUniform(Uniform("v", VarType(glu::TYPE_FLOAT_VEC2, PRECISION_LOW), UNUSED_BOTH));
		block.addUniform(Uniform("t", VarType(&typeT), 0));
		block.addUniform(Uniform("u", VarType(glu::TYPE_UINT, PRECISION_HIGH), 0));
		block.setFlags(layoutFlags);

		if (numInstances > 0)
		{
			block.setInstanceName("block");
			block.setArraySize(numInstances);
		}

		init();
	}